

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

void __thiscall CCharmapToLocal::load_table(CCharmapToLocal *this,osfildef *fp)

{
  int iVar1;
  wchar_t unicode_char;
  size_t sVar2;
  unsigned_long uVar3;
  void *pvVar4;
  FILE *in_RSI;
  long in_RDI;
  size_t i;
  uint xlen_1;
  wchar_t codept_1;
  uint xlen;
  wchar_t codept;
  uint next_ofs;
  ulong xchars;
  ulong xbytes;
  uint cnt;
  uchar buf [256];
  ulong ofs;
  ulong startpos;
  ulong local_160;
  uint in_stack_fffffffffffffea8;
  wchar_t in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb4;
  uint local_144;
  uint local_12c;
  undefined4 local_128;
  ulong local_20;
  long local_18;
  FILE *local_10;
  
  local_10 = in_RSI;
  local_18 = ftell(in_RSI);
  sVar2 = fread(&local_128,4,1,local_10);
  if (sVar2 == 1) {
    uVar3 = ::osrp4(&local_128);
    local_20 = uVar3 & 0xffffffff;
    fseek(local_10,local_18 + local_20,0);
    sVar2 = fread(&local_128,6,1,local_10);
    if (sVar2 == 1) {
      local_12c = ::osrp2(&local_128);
      uVar3 = ::osrp4((void *)((long)&local_128 + 2));
      if ((uVar3 & 0xffffffff) < 0x100000000) {
        pvVar4 = malloc(uVar3 & 0xffffffff);
        *(void **)(in_RDI + 0x1010) = pvVar4;
        if (*(long *)(in_RDI + 0x1010) != 0) {
          local_144 = 0;
          for (; local_12c != 0; local_12c = local_12c + -1) {
            sVar2 = fread(&local_128,3,1,local_10);
            if (sVar2 != 1) {
              return;
            }
            ::osrp2(&local_128);
            in_stack_fffffffffffffeb4 = (uint)local_128._2_1_;
            set_mapping((CCharmapToLocal *)
                        (ulong)CONCAT14(local_128._2_1_,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
            *(byte *)(*(long *)(in_RDI + 0x1010) + (ulong)local_144) = local_128._2_1_;
            sVar2 = fread((void *)(*(long *)(in_RDI + 0x1010) + (ulong)(local_144 + 1)),
                          (ulong)in_stack_fffffffffffffeb4,1,local_10);
            if (sVar2 != 1) {
              return;
            }
            local_144 = in_stack_fffffffffffffeb4 + local_144 + 1;
          }
          sVar2 = fread(&local_128,6,1,local_10);
          if ((sVar2 == 1) && (local_128 != 0x464f4524)) {
            local_12c = ::osrp2(&local_128);
            uVar3 = ::osrp4((void *)((long)&local_128 + 2));
            pvVar4 = malloc(((ulong)local_12c + (uVar3 & 0xffffffff) + 1) * 4);
            *(void **)(in_RDI + 0x1020) = pvVar4;
            if (*(long *)(in_RDI + 0x1020) != 0) {
              local_144 = 1;
              while ((local_12c != 0 && (sVar2 = fread(&local_128,3,1,local_10), sVar2 == 1))) {
                iVar1 = ::osrp2(&local_128);
                unicode_char = local_128 >> 0x10 & 0xff;
                set_exp_mapping((CCharmapToLocal *)CONCAT44(in_stack_fffffffffffffeb4,iVar1),
                                unicode_char,in_stack_fffffffffffffea8);
                *(wchar_t *)(*(long *)(in_RDI + 0x1020) + (ulong)local_144 * 4) = unicode_char;
                for (local_160 = 0; local_144 = local_144 + 1, local_160 < (uint)unicode_char;
                    local_160 = local_160 + 1) {
                  sVar2 = fread(&local_128,2,1,local_10);
                  if (sVar2 != 1) {
                    return;
                  }
                  iVar1 = ::osrp2(&local_128);
                  *(int *)(*(long *)(in_RDI + 0x1020) + (ulong)local_144 * 4) = iVar1;
                }
                local_12c = local_12c - 1;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CCharmapToLocal::load_table(osfildef *fp)
{
    ulong startpos;
    ulong ofs;
    uchar buf[256];
    uint cnt;
    ulong xbytes;
    ulong xchars;
    uint next_ofs;
    
    /* note the initial seek position */
    startpos = osfpos(fp);

    /* read the first entry, which gives the offset of the to-local table */
    if (osfrb(fp, buf, 4))
        return;
    ofs = t3rp4u(buf);

    /* seek to the to-local table */
    osfseek(fp, startpos + ofs, OSFSK_SET);

    /* read the number of entries and number of bytes needed */
    if (osfrb(fp, buf, 6))
        return;
    cnt = osrp2(buf);
    xbytes = t3rp4u(buf + 2);

    /* 
     *   Allocate space for the translation table.  Note that we cannot
     *   handle translation tables bigger than the maximum allowed in a
     *   single allocation unit on the operating system. 
     */
    if (xbytes > OSMALMAX)
        return;
    xlat_array_ = (unsigned char *)t3malloc(xbytes);
    if (xlat_array_ == 0)
        return;

    /*
     *   Read each mapping 
     */
    for (next_ofs = 0 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        
        /* read the code point and translation length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and translation length */
        codept = osrp2(buf);
        xlen = (unsigned int)buf[2];

        /* assign the mapping */
        set_mapping(codept, next_ofs);

        /* store the translation length */
        xlat_array_[next_ofs++] = buf[2];

        /* read the translation bytes */
        if (osfrb(fp, xlat_array_ + next_ofs, xlen))
            return;

        /* skip past the translation bytes we've read */
        next_ofs += xlen;
    }

    /*
     *   Next, read the expansions, if present.
     *   
     *   If we find the $EOF marker, it means it's an old-format file without
     *   the separate expansion definitions.  Otherwise, we'll have the
     *   expansion entry count and the aggregate number of unicode characters
     *   in all of the expansions.  
     */
    if (osfrb(fp, buf, 6) || memcmp(buf, "$EOF", 4) == 0)
        return;

    /* decode the expansion entry count and aggregate length */
    cnt = osrp2(buf);
    xchars = t3rp4u(buf + 2);

    /* 
     *   add one entry so that we can leave index zero unused, to indicate
     *   unmapped characters 
     */
    ++xchars;

    /* add one array slot per entry, for the length prefix slots */
    xchars += cnt;

    /* allocate space for the expansions */
    exp_array_ = (wchar_t *)t3malloc(xchars * sizeof(wchar_t));
    if (exp_array_ == 0)
        return;

    /* 
     *   read the mappings; start loading them at index 1, since we want to
     *   leave index 0 unused so that it can indicate unused mappings 
     */
    for (next_ofs = 1 ; cnt > 0 ; --cnt)
    {
        wchar_t codept;
        uint xlen;
        size_t i;

        /* read this entry's unicode value and expansion character length */
        if (osfrb(fp, buf, 3))
            return;

        /* decode the code point and expansion length */
        codept = osrp2(buf);
        xlen = (uint)buf[2];

        /* assign the expansion mapping */
        set_exp_mapping(codept, next_ofs);

        /* set the length prefix */
        exp_array_[next_ofs++] = (wchar_t)xlen;

        /* read and store the expansion characters */
        for (i = 0 ; i < xlen ; ++i)
        {
            /* read this translation */
            if (osfrb(fp, buf, 2))
                return;

            /* decode and store this translation */
            exp_array_[next_ofs++] = osrp2(buf);
        }
    }
}